

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

X509_SIG *
PKCS8_encrypt(int pbe_nid,EVP_CIPHER *cipher,char *pass,int passlen,uchar *salt,int saltlen,int iter
             ,PKCS8_PRIV_KEY_INFO *p8)

{
  int iVar1;
  undefined4 in_register_0000008c;
  undefined1 local_a0 [8];
  CBB cbb;
  size_t der_len;
  uint8_t *ptr;
  uint8_t *der;
  X509_SIG *ret;
  EVP_PKEY *pkey;
  size_t pass_len;
  size_t salt_len_local;
  uint8_t *salt_local;
  char *pcStack_28;
  int pass_len_in_local;
  char *pass_local;
  EVP_CIPHER *cipher_local;
  X509_SIG *pXStack_10;
  int pbe_nid_local;
  
  pass_len = CONCAT44(in_register_0000008c,saltlen);
  salt_len_local = (size_t)salt;
  salt_local._4_4_ = passlen;
  pcStack_28 = pass;
  pass_local = (char *)cipher;
  cipher_local._4_4_ = pbe_nid;
  if ((passlen == -1) && (pass != (char *)0x0)) {
    pkey = (EVP_PKEY *)strlen(pass);
  }
  else {
    pkey = (EVP_PKEY *)(long)passlen;
  }
  ret = (X509_SIG *)EVP_PKCS82PKEY(p8);
  if ((EVP_PKEY *)ret == (EVP_PKEY *)0x0) {
    pXStack_10 = (X509_SIG *)0x0;
  }
  else {
    der = (uint8_t *)0x0;
    ptr = (uint8_t *)0x0;
    iVar1 = CBB_init((CBB *)local_a0,0x80);
    if (((iVar1 == 0) ||
        (iVar1 = PKCS8_marshal_encrypted_private_key
                           ((CBB *)local_a0,cipher_local._4_4_,(EVP_CIPHER *)pass_local,pcStack_28,
                            (size_t)pkey,(uint8_t *)salt_len_local,pass_len,iter,(EVP_PKEY *)ret),
        iVar1 == 0)) ||
       (iVar1 = CBB_finish((CBB *)local_a0,&ptr,(size_t *)((long)&cbb.u + 0x18)), iVar1 == 0)) {
      CBB_cleanup((CBB *)local_a0);
    }
    else {
      der_len = (size_t)ptr;
      der = (uint8_t *)d2i_X509_SIG((X509_SIG **)0x0,(uchar **)&der_len,cbb.u._24_8_);
      if (((X509_SIG *)der == (X509_SIG *)0x0) || ((uint8_t *)der_len != ptr + cbb.u._24_8_)) {
        ERR_put_error(0x13,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0xb4);
        X509_SIG_free((X509_SIG *)der);
        der = (uint8_t *)0x0;
      }
    }
    OPENSSL_free(ptr);
    EVP_PKEY_free((EVP_PKEY *)ret);
    pXStack_10 = (X509_SIG *)der;
  }
  return pXStack_10;
}

Assistant:

X509_SIG *PKCS8_encrypt(int pbe_nid, const EVP_CIPHER *cipher, const char *pass,
                        int pass_len_in, const uint8_t *salt, size_t salt_len,
                        int iterations, PKCS8_PRIV_KEY_INFO *p8inf) {
  size_t pass_len;
  if (pass_len_in == -1 && pass != NULL) {
    pass_len = strlen(pass);
  } else {
    pass_len = (size_t)pass_len_in;
  }

  // Parse out the private key.
  EVP_PKEY *pkey = EVP_PKCS82PKEY(p8inf);
  if (pkey == NULL) {
    return NULL;
  }

  X509_SIG *ret = NULL;
  uint8_t *der = NULL;
  const uint8_t *ptr;
  size_t der_len;
  CBB cbb;
  if (!CBB_init(&cbb, 128) ||
      !PKCS8_marshal_encrypted_private_key(&cbb, pbe_nid, cipher, pass,
                                           pass_len, salt, salt_len, iterations,
                                           pkey) ||
      !CBB_finish(&cbb, &der, &der_len)) {
    CBB_cleanup(&cbb);
    goto err;
  }

  // Convert back to legacy ASN.1 objects.
  ptr = der;
  ret = d2i_X509_SIG(NULL, &ptr, der_len);
  if (ret == NULL || ptr != der + der_len) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_INTERNAL_ERROR);
    X509_SIG_free(ret);
    ret = NULL;
  }

err:
  OPENSSL_free(der);
  EVP_PKEY_free(pkey);
  return ret;
}